

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h8_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  ushort uVar85;
  uint uVar86;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  s16 tmp [64];
  __m128i min_val_3;
  __m128i max_val_3;
  __m128i zero_1;
  __m128i offset_3;
  __m128i t3_3;
  __m128i t2_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i eo1_3;
  __m128i eo0_3;
  __m128i ee1_3;
  __m128i ee0_3;
  __m128i o3_3;
  __m128i o2_3;
  __m128i o1_3;
  __m128i o0_3;
  __m128i e3_3;
  __m128i e2_3;
  __m128i e1_3;
  __m128i e0_3;
  __m128i s7_3;
  __m128i s6_3;
  __m128i s5_3;
  __m128i s4_3;
  __m128i s3_3;
  __m128i s2_3;
  __m128i s1_3;
  __m128i s0_3;
  __m128i coeff_p17_n42_3;
  __m128i coeff_p42_p17_3;
  __m128i coeff_p32_n32_3;
  __m128i coeff_p32_p32_3;
  __m128i coeff_p38_n44_3;
  __m128i coeff_p9_n25_3;
  __m128i coeff_p9_p38_3;
  __m128i coeff_p25_n44_3;
  __m128i coeff_n44_n25_3;
  __m128i coeff_p38_n9_3;
  __m128i coeff_p25_p9_3;
  __m128i coeff_p44_p38_3;
  __m256i min_val_2;
  __m256i max_val_2;
  int i_src7_1;
  int i_src6_1;
  int i_src5_1;
  int i_src4_1;
  int i_src3_1;
  int i_src2_1;
  int j_1;
  __m256i offset_2;
  __m256i d7_1;
  __m256i d6_1;
  __m256i d5_1;
  __m256i d4_1;
  __m256i d3_1;
  __m256i d2_1;
  __m256i d1_1;
  __m256i d0_1;
  __m256i t3_2;
  __m256i t2_2;
  __m256i t1_2;
  __m256i t0_2;
  __m256i eo1_2;
  __m256i eo0_2;
  __m256i ee1_2;
  __m256i ee0_2;
  __m256i o3_2;
  __m256i o2_2;
  __m256i o1_2;
  __m256i o0_2;
  __m256i e3_2;
  __m256i e2_2;
  __m256i e1_2;
  __m256i e0_2;
  __m128i ss3_1;
  __m128i ss2_1;
  __m128i ss1_1;
  __m128i ss0_1;
  __m128i s7_2;
  __m128i s6_2;
  __m128i s5_2;
  __m128i s4_2;
  __m128i s3_2;
  __m128i s2_2;
  __m128i s1_2;
  __m128i s0_2;
  __m256i coeff_p17_n42_2;
  __m256i coeff_p42_p17_2;
  __m256i coeff_p32_n32_2;
  __m256i coeff_p32_p32_2;
  __m256i coeff_p38_n44_2;
  __m256i coeff_p9_n25_2;
  __m256i coeff_p9_p38_2;
  __m256i coeff_p25_n44_2;
  __m256i coeff_n44_n25_2;
  __m256i coeff_p38_n9_2;
  __m256i coeff_p25_p9_2;
  __m256i coeff_p44_p38_2;
  __m128i min_val_1;
  __m128i max_val_1;
  __m128i zero;
  __m128i offset_1;
  __m128i t3_1;
  __m128i t2_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i eo1_1;
  __m128i eo0_1;
  __m128i ee1_1;
  __m128i ee0_1;
  __m128i o3_1;
  __m128i o2_1;
  __m128i o1_1;
  __m128i o0_1;
  __m128i e3_1;
  __m128i e2_1;
  __m128i e1_1;
  __m128i e0_1;
  __m128i s7_1;
  __m128i s6_1;
  __m128i s5_1;
  __m128i s4_1;
  __m128i s3_1;
  __m128i s2_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i coeff_p17_n42_1;
  __m128i coeff_p42_p17_1;
  __m128i coeff_p32_n32_1;
  __m128i coeff_p32_p32_1;
  __m128i coeff_p38_n44_1;
  __m128i coeff_p9_n25_1;
  __m128i coeff_p9_p38_1;
  __m128i coeff_p25_n44_1;
  __m128i coeff_n44_n25_1;
  __m128i coeff_p38_n9_1;
  __m128i coeff_p25_p9_1;
  __m128i coeff_p44_p38_1;
  __m256i min_val;
  __m256i max_val;
  int i_src7;
  int i_src6;
  int i_src5;
  int i_src4;
  int i_src3;
  int i_src2;
  int j;
  __m256i offset;
  __m256i d7;
  __m256i d6;
  __m256i d5;
  __m256i d4;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i eo1;
  __m256i eo0;
  __m256i ee1;
  __m256i ee0;
  __m256i o3;
  __m256i o2;
  __m256i o1;
  __m256i o0;
  __m256i e3;
  __m256i e2;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m256i coeff_p17_n42;
  __m256i coeff_p42_p17;
  __m256i coeff_p32_n32;
  __m256i coeff_p32_p32;
  __m256i coeff_p38_n44;
  __m256i coeff_p9_n25;
  __m256i coeff_p9_p38;
  __m256i coeff_p25_n44;
  __m256i coeff_n44_n25;
  __m256i coeff_p38_n9;
  __m256i coeff_p25_p9;
  __m256i coeff_p44_p38;
  undefined8 local_5820 [2];
  undefined1 auStack_5810 [16];
  undefined1 local_5800 [16];
  undefined1 auStack_57f0 [16];
  undefined1 local_57e0 [16];
  undefined1 auStack_57d0 [16];
  undefined1 local_57c0 [16];
  undefined1 auStack_57b0 [28];
  int local_5794;
  undefined8 *local_5790;
  int local_54a4;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 local_5160;
  undefined8 uStack_5158;
  byte local_4f3c;
  char local_4f38;
  undefined8 *local_4f30;
  int local_3764;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 *local_31f0;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  
  local_31f0 = local_5820;
  auVar5 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar5 = vpinsrd_avx(auVar5,0x26002c,2);
  auVar5 = vpinsrd_avx(auVar5,0x26002c,3);
  auVar6 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar6 = vpinsrd_avx(auVar6,0x26002c,2);
  auVar6 = vpinsrd_avx(auVar6,0x26002c,3);
  uStack_19f0 = auVar6._0_8_;
  uStack_19e8 = auVar6._8_8_;
  auVar6 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar6 = vpinsrd_avx(auVar6,0x90019,2);
  auVar6 = vpinsrd_avx(auVar6,0x90019,3);
  auVar7 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar7 = vpinsrd_avx(auVar7,0x90019,2);
  auVar7 = vpinsrd_avx(auVar7,0x90019,3);
  uStack_1a30 = auVar7._0_8_;
  uStack_1a28 = auVar7._8_8_;
  auVar7 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar7 = vpinsrd_avx(auVar7,0xfff70026,2);
  auVar7 = vpinsrd_avx(auVar7,0xfff70026,3);
  auVar8 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar8 = vpinsrd_avx(auVar8,0xfff70026,2);
  auVar8 = vpinsrd_avx(auVar8,0xfff70026,3);
  uStack_1a70 = auVar8._0_8_;
  uStack_1a68 = auVar8._8_8_;
  auVar8 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar8 = vpinsrd_avx(auVar8,0xffe7ffd4,2);
  auVar8 = vpinsrd_avx(auVar8,0xffe7ffd4,3);
  auVar9 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar9 = vpinsrd_avx(auVar9,0xffe7ffd4,2);
  auVar9 = vpinsrd_avx(auVar9,0xffe7ffd4,3);
  uStack_1ab0 = auVar9._0_8_;
  uStack_1aa8 = auVar9._8_8_;
  auVar9 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar9 = vpinsrd_avx(auVar9,0xffd40019,2);
  auVar9 = vpinsrd_avx(auVar9,0xffd40019,3);
  auVar10 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar10 = vpinsrd_avx(auVar10,0xffd40019,2);
  auVar10 = vpinsrd_avx(auVar10,0xffd40019,3);
  uStack_1af0 = auVar10._0_8_;
  uStack_1ae8 = auVar10._8_8_;
  auVar10 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar10 = vpinsrd_avx(auVar10,0x260009,2);
  auVar10 = vpinsrd_avx(auVar10,0x260009,3);
  auVar11 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar11 = vpinsrd_avx(auVar11,0x260009,2);
  auVar11 = vpinsrd_avx(auVar11,0x260009,3);
  uStack_1b30 = auVar11._0_8_;
  uStack_1b28 = auVar11._8_8_;
  auVar11 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar11 = vpinsrd_avx(auVar11,0xffe70009,2);
  auVar11 = vpinsrd_avx(auVar11,0xffe70009,3);
  auVar12 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar12 = vpinsrd_avx(auVar12,0xffe70009,2);
  auVar12 = vpinsrd_avx(auVar12,0xffe70009,3);
  uStack_1b70 = auVar12._0_8_;
  uStack_1b68 = auVar12._8_8_;
  auVar12 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar12 = vpinsrd_avx(auVar12,0xffd40026,2);
  auVar12 = vpinsrd_avx(auVar12,0xffd40026,3);
  auVar13 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar13 = vpinsrd_avx(auVar13,0xffd40026,2);
  auVar13 = vpinsrd_avx(auVar13,0xffd40026,3);
  uStack_1bb0 = auVar13._0_8_;
  uStack_1ba8 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar13 = vpinsrd_avx(auVar13,0x200020,2);
  auVar13 = vpinsrd_avx(auVar13,0x200020,3);
  auVar14 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar14 = vpinsrd_avx(auVar14,0x200020,2);
  auVar14 = vpinsrd_avx(auVar14,0x200020,3);
  uStack_1bf0 = auVar14._0_8_;
  uStack_1be8 = auVar14._8_8_;
  auVar14 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar14 = vpinsrd_avx(auVar14,0xffe00020,2);
  auVar14 = vpinsrd_avx(auVar14,0xffe00020,3);
  auVar15 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar15 = vpinsrd_avx(auVar15,0xffe00020,2);
  auVar15 = vpinsrd_avx(auVar15,0xffe00020,3);
  uStack_1c30 = auVar15._0_8_;
  uStack_1c28 = auVar15._8_8_;
  auVar15 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar15 = vpinsrd_avx(auVar15,0x11002a,2);
  auVar15 = vpinsrd_avx(auVar15,0x11002a,3);
  auVar16 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar16 = vpinsrd_avx(auVar16,0x11002a,2);
  auVar16 = vpinsrd_avx(auVar16,0x11002a,3);
  uStack_1c70 = auVar16._0_8_;
  uStack_1c68 = auVar16._8_8_;
  auVar16 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar16 = vpinsrd_avx(auVar16,0xffd60011,2);
  auVar16 = vpinsrd_avx(auVar16,0xffd60011,3);
  auVar89 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar89 = vpinsrd_avx(auVar89,0xffd60011,2);
  auVar89 = vpinsrd_avx(auVar89,0xffd60011,3);
  uStack_1cb0 = auVar89._0_8_;
  uStack_1ca8 = auVar89._8_8_;
  auVar89 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar89 = vpinsrd_avx(auVar89,0x10,2);
  auVar89 = vpinsrd_avx(auVar89,0x10,3);
  auVar87 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar87 = vpinsrd_avx(auVar87,0x10,2);
  auVar87 = vpinsrd_avx(auVar87,0x10,3);
  auVar87 = ZEXT116(0) * auVar89 + ZEXT116(1) * auVar87;
  auVar89 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  local_3764 = 0;
  local_5794 = in_EDX;
  local_5790 = in_RSI;
  while( true ) {
    uStack_3748 = auVar89._8_8_;
    uStack_3750 = auVar89._0_8_;
    if (7 < local_3764) break;
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + (long)local_3764 * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + (long)local_3764 * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x50 + (long)local_3764 * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x70 + (long)local_3764 * 2);
    auVar17 = vpunpcklwd_avx(*pauVar1,*pauVar2);
    auVar90 = vpunpckhwd_avx(*pauVar1,*pauVar2);
    auVar18 = vpunpcklwd_avx(*pauVar3,*pauVar4);
    auVar88 = vpunpckhwd_avx(*pauVar3,*pauVar4);
    local_3420 = auVar90._0_8_;
    uStack_3418 = auVar90._8_8_;
    local_3440 = auVar88._0_8_;
    uStack_3438 = auVar88._8_8_;
    auVar79._16_8_ = local_3420;
    auVar79._0_16_ = auVar17;
    auVar79._24_8_ = uStack_3418;
    auVar19._16_8_ = uStack_19f0;
    auVar19._0_16_ = auVar5;
    auVar19._24_8_ = uStack_19e8;
    auVar19 = vpmaddwd_avx2(auVar79,auVar19);
    auVar78._16_8_ = local_3440;
    auVar78._0_16_ = auVar18;
    auVar78._24_8_ = uStack_3438;
    auVar20._16_8_ = uStack_1a30;
    auVar20._0_16_ = auVar6;
    auVar20._24_8_ = uStack_1a28;
    auVar20 = vpmaddwd_avx2(auVar78,auVar20);
    auVar77._16_8_ = local_3420;
    auVar77._0_16_ = auVar17;
    auVar77._24_8_ = uStack_3418;
    auVar76._16_8_ = uStack_1a70;
    auVar76._0_16_ = auVar7;
    auVar76._24_8_ = uStack_1a68;
    auVar21 = vpmaddwd_avx2(auVar77,auVar76);
    auVar75._16_8_ = local_3440;
    auVar75._0_16_ = auVar18;
    auVar75._24_8_ = uStack_3438;
    auVar74._16_8_ = uStack_1ab0;
    auVar74._0_16_ = auVar8;
    auVar74._24_8_ = uStack_1aa8;
    auVar22 = vpmaddwd_avx2(auVar75,auVar74);
    auVar19 = vpaddd_avx2(auVar19,auVar20);
    auVar20 = vpaddd_avx2(auVar21,auVar22);
    auVar73._16_8_ = local_3420;
    auVar73._0_16_ = auVar17;
    auVar73._24_8_ = uStack_3418;
    auVar21._16_8_ = uStack_1af0;
    auVar21._0_16_ = auVar9;
    auVar21._24_8_ = uStack_1ae8;
    auVar21 = vpmaddwd_avx2(auVar73,auVar21);
    auVar72._16_8_ = local_3440;
    auVar72._0_16_ = auVar18;
    auVar72._24_8_ = uStack_3438;
    auVar22._16_8_ = uStack_1b30;
    auVar22._0_16_ = auVar10;
    auVar22._24_8_ = uStack_1b28;
    auVar22 = vpmaddwd_avx2(auVar72,auVar22);
    auVar71._16_8_ = local_3420;
    auVar71._0_16_ = auVar17;
    auVar71._24_8_ = uStack_3418;
    auVar70._16_8_ = uStack_1b70;
    auVar70._0_16_ = auVar11;
    auVar70._24_8_ = uStack_1b68;
    auVar23 = vpmaddwd_avx2(auVar71,auVar70);
    auVar69._16_8_ = local_3440;
    auVar69._0_16_ = auVar18;
    auVar69._24_8_ = uStack_3438;
    auVar68._16_8_ = uStack_1bb0;
    auVar68._0_16_ = auVar12;
    auVar68._24_8_ = uStack_1ba8;
    auVar24 = vpmaddwd_avx2(auVar69,auVar68);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar22 = vpaddd_avx2(auVar23,auVar24);
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_3764 * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x20 + (long)local_3764 * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x40 + (long)local_3764 * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x60 + (long)local_3764 * 2);
    auVar17 = vpunpcklwd_avx(*pauVar1,*pauVar3);
    auVar90 = vpunpckhwd_avx(*pauVar1,*pauVar3);
    auVar18 = vpunpcklwd_avx(*pauVar2,*pauVar4);
    auVar88 = vpunpckhwd_avx(*pauVar2,*pauVar4);
    local_3420 = auVar90._0_8_;
    uStack_3418 = auVar90._8_8_;
    local_3440 = auVar88._0_8_;
    uStack_3438 = auVar88._8_8_;
    auVar30._16_8_ = local_3420;
    auVar30._0_16_ = auVar17;
    auVar30._24_8_ = uStack_3418;
    auVar24._16_8_ = uStack_1bf0;
    auVar24._0_16_ = auVar13;
    auVar24._24_8_ = uStack_1be8;
    auVar24 = vpmaddwd_avx2(auVar30,auVar24);
    auVar29._16_8_ = local_3420;
    auVar29._0_16_ = auVar17;
    auVar29._24_8_ = uStack_3418;
    auVar25._16_8_ = uStack_1c30;
    auVar25._0_16_ = auVar14;
    auVar25._24_8_ = uStack_1c28;
    auVar25 = vpmaddwd_avx2(auVar29,auVar25);
    auVar28._16_8_ = local_3440;
    auVar28._0_16_ = auVar18;
    auVar28._24_8_ = uStack_3438;
    auVar26._16_8_ = uStack_1c70;
    auVar26._0_16_ = auVar15;
    auVar26._24_8_ = uStack_1c68;
    auVar26 = vpmaddwd_avx2(auVar28,auVar26);
    auVar27._16_8_ = local_3440;
    auVar27._0_16_ = auVar18;
    auVar27._24_8_ = uStack_3438;
    auVar23._16_8_ = uStack_1cb0;
    auVar23._0_16_ = auVar16;
    auVar23._24_8_ = uStack_1ca8;
    auVar27 = vpmaddwd_avx2(auVar27,auVar23);
    auVar23 = vpaddd_avx2(auVar24,auVar26);
    auVar26 = vpsubd_avx2(auVar24,auVar26);
    auVar24 = vpaddd_avx2(auVar25,auVar27);
    auVar27 = vpsubd_avx2(auVar25,auVar27);
    auVar83._16_8_ = uStack_3750;
    auVar83._0_16_ = auVar87;
    auVar83._24_8_ = uStack_3748;
    auVar23 = vpaddd_avx2(auVar23,auVar83);
    auVar82._16_8_ = uStack_3750;
    auVar82._0_16_ = auVar87;
    auVar82._24_8_ = uStack_3748;
    auVar25 = vpaddd_avx2(auVar26,auVar82);
    auVar81._16_8_ = uStack_3750;
    auVar81._0_16_ = auVar87;
    auVar81._24_8_ = uStack_3748;
    auVar24 = vpaddd_avx2(auVar24,auVar81);
    auVar80._16_8_ = uStack_3750;
    auVar80._0_16_ = auVar87;
    auVar80._24_8_ = uStack_3748;
    auVar26 = vpaddd_avx2(auVar27,auVar80);
    auVar27 = vpaddd_avx2(auVar23,auVar19);
    auVar23 = vpsubd_avx2(auVar23,auVar19);
    auVar19 = vpaddd_avx2(auVar24,auVar20);
    auVar28 = vpsubd_avx2(auVar24,auVar20);
    auVar20 = vpaddd_avx2(auVar26,auVar21);
    auVar29 = vpsubd_avx2(auVar26,auVar21);
    auVar21 = vpaddd_avx2(auVar25,auVar22);
    auVar30 = vpsubd_avx2(auVar25,auVar22);
    auVar22 = vpsrad_avx2(auVar27,ZEXT416(5));
    auVar23 = vpsrad_avx2(auVar23,ZEXT416(5));
    auVar24 = vpsrad_avx2(auVar19,ZEXT416(5));
    auVar25 = vpsrad_avx2(auVar28,ZEXT416(5));
    auVar26 = vpsrad_avx2(auVar20,ZEXT416(5));
    auVar20 = vpsrad_avx2(auVar29,ZEXT416(5));
    auVar27 = vpsrad_avx2(auVar21,ZEXT416(5));
    auVar19 = vpsrad_avx2(auVar30,ZEXT416(5));
    auVar19 = vpackssdw_avx2(auVar22,auVar19);
    auVar20 = vpackssdw_avx2(auVar24,auVar20);
    auVar21 = vpackssdw_avx2(auVar26,auVar25);
    auVar22 = vpackssdw_avx2(auVar27,auVar23);
    auVar23 = vpunpcklwd_avx2(auVar19,auVar21);
    auVar19 = vpunpckhwd_avx2(auVar19,auVar21);
    auVar21 = vpunpcklwd_avx2(auVar20,auVar22);
    auVar20 = vpunpckhwd_avx2(auVar20,auVar22);
    auVar22 = vpunpcklwd_avx2(auVar23,auVar21);
    auVar21 = vpunpckhwd_avx2(auVar23,auVar21);
    auVar23 = vpunpcklwd_avx2(auVar19,auVar20);
    auVar19 = vpunpckhwd_avx2(auVar19,auVar20);
    auVar24 = vpunpcklqdq_avx2(auVar22,auVar23);
    auVar20 = vpunpckhqdq_avx2(auVar22,auVar23);
    auVar22 = vpunpcklqdq_avx2(auVar21,auVar19);
    auVar19 = vpunpckhqdq_avx2(auVar21,auVar19);
    auVar21 = vperm2i128_avx2(auVar24,auVar20,0x20);
    auVar20 = vperm2i128_avx2(auVar24,auVar20,0x31);
    auVar23 = vperm2i128_avx2(auVar22,auVar19,0x20);
    auVar19 = vperm2i128_avx2(auVar22,auVar19,0x31);
    local_3660 = auVar21._0_8_;
    uStack_3658 = auVar21._8_8_;
    uStack_3650 = auVar21._16_8_;
    uStack_3648 = auVar21._24_8_;
    *local_31f0 = local_3660;
    local_31f0[1] = uStack_3658;
    local_31f0[2] = uStack_3650;
    local_31f0[3] = uStack_3648;
    local_3680 = auVar23._0_8_;
    uStack_3678 = auVar23._8_8_;
    uStack_3670 = auVar23._16_8_;
    uStack_3668 = auVar23._24_8_;
    local_31f0[4] = local_3680;
    local_31f0[5] = uStack_3678;
    local_31f0[6] = uStack_3670;
    local_31f0[7] = uStack_3668;
    local_36a0 = auVar20._0_8_;
    uStack_3698 = auVar20._8_8_;
    uStack_3690 = auVar20._16_8_;
    uStack_3688 = auVar20._24_8_;
    local_31f0[8] = local_36a0;
    local_31f0[9] = uStack_3698;
    local_31f0[10] = uStack_3690;
    local_31f0[0xb] = uStack_3688;
    local_36c0 = auVar19._0_8_;
    uStack_36b8 = auVar19._8_8_;
    uStack_36b0 = auVar19._16_8_;
    uStack_36a8 = auVar19._24_8_;
    local_31f0[0xc] = local_36c0;
    local_31f0[0xd] = uStack_36b8;
    local_31f0[0xe] = uStack_36b0;
    local_31f0[0xf] = uStack_36a8;
    local_31f0 = local_31f0 + 0x10;
    local_3764 = local_3764 + 8;
  }
  uVar86 = 0x14 - local_5794;
  local_4f30 = local_5790;
  local_4f38 = (char)uVar86;
  local_4f3c = (byte)local_5794;
  auVar5 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar5 = vpinsrd_avx(auVar5,0x26002c,2);
  auVar5 = vpinsrd_avx(auVar5,0x26002c,3);
  auVar6 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar6 = vpinsrd_avx(auVar6,0x26002c,2);
  auVar6 = vpinsrd_avx(auVar6,0x26002c,3);
  uStack_16b0 = auVar6._0_8_;
  uStack_16a8 = auVar6._8_8_;
  auVar6 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar6 = vpinsrd_avx(auVar6,0x90019,2);
  auVar6 = vpinsrd_avx(auVar6,0x90019,3);
  auVar7 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar7 = vpinsrd_avx(auVar7,0x90019,2);
  auVar7 = vpinsrd_avx(auVar7,0x90019,3);
  uStack_16f0 = auVar7._0_8_;
  uStack_16e8 = auVar7._8_8_;
  auVar7 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar7 = vpinsrd_avx(auVar7,0xfff70026,2);
  auVar7 = vpinsrd_avx(auVar7,0xfff70026,3);
  auVar8 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar8 = vpinsrd_avx(auVar8,0xfff70026,2);
  auVar8 = vpinsrd_avx(auVar8,0xfff70026,3);
  uStack_1730 = auVar8._0_8_;
  uStack_1728 = auVar8._8_8_;
  auVar8 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar8 = vpinsrd_avx(auVar8,0xffe7ffd4,2);
  auVar8 = vpinsrd_avx(auVar8,0xffe7ffd4,3);
  auVar9 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar9 = vpinsrd_avx(auVar9,0xffe7ffd4,2);
  auVar9 = vpinsrd_avx(auVar9,0xffe7ffd4,3);
  uStack_1770 = auVar9._0_8_;
  uStack_1768 = auVar9._8_8_;
  auVar9 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar9 = vpinsrd_avx(auVar9,0xffd40019,2);
  auVar9 = vpinsrd_avx(auVar9,0xffd40019,3);
  auVar10 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar10 = vpinsrd_avx(auVar10,0xffd40019,2);
  auVar10 = vpinsrd_avx(auVar10,0xffd40019,3);
  uStack_17b0 = auVar10._0_8_;
  uStack_17a8 = auVar10._8_8_;
  auVar10 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar10 = vpinsrd_avx(auVar10,0x260009,2);
  auVar10 = vpinsrd_avx(auVar10,0x260009,3);
  auVar11 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar11 = vpinsrd_avx(auVar11,0x260009,2);
  auVar11 = vpinsrd_avx(auVar11,0x260009,3);
  uStack_17f0 = auVar11._0_8_;
  uStack_17e8 = auVar11._8_8_;
  auVar11 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar11 = vpinsrd_avx(auVar11,0xffe70009,2);
  auVar11 = vpinsrd_avx(auVar11,0xffe70009,3);
  auVar12 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar12 = vpinsrd_avx(auVar12,0xffe70009,2);
  auVar12 = vpinsrd_avx(auVar12,0xffe70009,3);
  uStack_1830 = auVar12._0_8_;
  uStack_1828 = auVar12._8_8_;
  auVar12 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar12 = vpinsrd_avx(auVar12,0xffd40026,2);
  auVar12 = vpinsrd_avx(auVar12,0xffd40026,3);
  auVar13 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar13 = vpinsrd_avx(auVar13,0xffd40026,2);
  auVar13 = vpinsrd_avx(auVar13,0xffd40026,3);
  uStack_1870 = auVar13._0_8_;
  uStack_1868 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar13 = vpinsrd_avx(auVar13,0x200020,2);
  auVar13 = vpinsrd_avx(auVar13,0x200020,3);
  auVar14 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar14 = vpinsrd_avx(auVar14,0x200020,2);
  auVar14 = vpinsrd_avx(auVar14,0x200020,3);
  uStack_18b0 = auVar14._0_8_;
  uStack_18a8 = auVar14._8_8_;
  auVar14 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar14 = vpinsrd_avx(auVar14,0xffe00020,2);
  auVar14 = vpinsrd_avx(auVar14,0xffe00020,3);
  auVar15 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar15 = vpinsrd_avx(auVar15,0xffe00020,2);
  auVar15 = vpinsrd_avx(auVar15,0xffe00020,3);
  uStack_18f0 = auVar15._0_8_;
  uStack_18e8 = auVar15._8_8_;
  auVar15 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar15 = vpinsrd_avx(auVar15,0x11002a,2);
  auVar15 = vpinsrd_avx(auVar15,0x11002a,3);
  auVar16 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar16 = vpinsrd_avx(auVar16,0x11002a,2);
  auVar16 = vpinsrd_avx(auVar16,0x11002a,3);
  uStack_1930 = auVar16._0_8_;
  uStack_1928 = auVar16._8_8_;
  auVar16 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar16 = vpinsrd_avx(auVar16,0xffd60011,2);
  auVar16 = vpinsrd_avx(auVar16,0xffd60011,3);
  auVar89 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar89 = vpinsrd_avx(auVar89,0xffd60011,2);
  auVar89 = vpinsrd_avx(auVar89,0xffd60011,3);
  uStack_1970 = auVar89._0_8_;
  uStack_1968 = auVar89._8_8_;
  uVar84 = 1 << (local_4f38 - 1U & 0x1f);
  auVar89 = vpinsrd_avx(ZEXT416(uVar84),uVar84,1);
  auVar89 = vpinsrd_avx(auVar89,uVar84,2);
  auVar89 = vpinsrd_avx(auVar89,uVar84,3);
  auVar87 = vpinsrd_avx(ZEXT416(uVar84),uVar84,1);
  auVar87 = vpinsrd_avx(auVar87,uVar84,2);
  auVar87 = vpinsrd_avx(auVar87,uVar84,3);
  auVar87 = ZEXT116(0) * auVar89 + ZEXT116(1) * auVar87;
  auVar89 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  uStack_19b0 = auVar89._0_8_;
  uStack_19a8 = auVar89._8_8_;
  for (local_54a4 = 0; local_54a4 < 8; local_54a4 = local_54a4 + 8) {
    auVar88 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_5810 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(auStack_57f0 + (long)local_54a4 * 2));
    auVar89 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_5810 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(auStack_57f0 + (long)local_54a4 * 2));
    auVar17 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_57d0 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(auStack_57b0 + (long)local_54a4 * 2));
    auVar90 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_57d0 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(auStack_57b0 + (long)local_54a4 * 2));
    local_5160 = auVar89._0_8_;
    uStack_5158 = auVar89._8_8_;
    local_5180 = auVar90._0_8_;
    uStack_5178 = auVar90._8_8_;
    auVar55._16_8_ = local_5160;
    auVar55._0_16_ = auVar88;
    auVar55._24_8_ = uStack_5158;
    auVar54._16_8_ = uStack_16b0;
    auVar54._0_16_ = auVar5;
    auVar54._24_8_ = uStack_16a8;
    auVar19 = vpmaddwd_avx2(auVar55,auVar54);
    auVar53._16_8_ = local_5180;
    auVar53._0_16_ = auVar17;
    auVar53._24_8_ = uStack_5178;
    auVar52._16_8_ = uStack_16f0;
    auVar52._0_16_ = auVar6;
    auVar52._24_8_ = uStack_16e8;
    auVar20 = vpmaddwd_avx2(auVar53,auVar52);
    auVar51._16_8_ = local_5160;
    auVar51._0_16_ = auVar88;
    auVar51._24_8_ = uStack_5158;
    auVar50._16_8_ = uStack_1730;
    auVar50._0_16_ = auVar7;
    auVar50._24_8_ = uStack_1728;
    auVar21 = vpmaddwd_avx2(auVar51,auVar50);
    auVar49._16_8_ = local_5180;
    auVar49._0_16_ = auVar17;
    auVar49._24_8_ = uStack_5178;
    auVar48._16_8_ = uStack_1770;
    auVar48._0_16_ = auVar8;
    auVar48._24_8_ = uStack_1768;
    auVar22 = vpmaddwd_avx2(auVar49,auVar48);
    auVar19 = vpaddd_avx2(auVar19,auVar20);
    auVar20 = vpaddd_avx2(auVar21,auVar22);
    auVar47._16_8_ = local_5160;
    auVar47._0_16_ = auVar88;
    auVar47._24_8_ = uStack_5158;
    auVar46._16_8_ = uStack_17b0;
    auVar46._0_16_ = auVar9;
    auVar46._24_8_ = uStack_17a8;
    auVar21 = vpmaddwd_avx2(auVar47,auVar46);
    auVar45._16_8_ = local_5180;
    auVar45._0_16_ = auVar17;
    auVar45._24_8_ = uStack_5178;
    auVar44._16_8_ = uStack_17f0;
    auVar44._0_16_ = auVar10;
    auVar44._24_8_ = uStack_17e8;
    auVar22 = vpmaddwd_avx2(auVar45,auVar44);
    auVar43._16_8_ = local_5160;
    auVar43._0_16_ = auVar88;
    auVar43._24_8_ = uStack_5158;
    auVar42._16_8_ = uStack_1830;
    auVar42._0_16_ = auVar11;
    auVar42._24_8_ = uStack_1828;
    auVar23 = vpmaddwd_avx2(auVar43,auVar42);
    auVar41._16_8_ = local_5180;
    auVar41._0_16_ = auVar17;
    auVar41._24_8_ = uStack_5178;
    auVar40._16_8_ = uStack_1870;
    auVar40._0_16_ = auVar12;
    auVar40._24_8_ = uStack_1868;
    auVar24 = vpmaddwd_avx2(auVar41,auVar40);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar22 = vpaddd_avx2(auVar23,auVar24);
    uVar31 = *(undefined8 *)((long)local_5820 + (long)local_54a4 * 2);
    auVar89._8_8_ = *(undefined8 *)(auStack_5810 + (long)local_54a4 * 2 + -8);
    auVar89._0_8_ = uVar31;
    auVar88 = vpunpcklwd_avx(auVar89,*(undefined1 (*) [16])(local_57e0 + (long)local_54a4 * 2));
    auVar90._8_8_ = *(undefined8 *)(auStack_5810 + (long)local_54a4 * 2 + -8);
    auVar90._0_8_ = uVar31;
    auVar89 = vpunpckhwd_avx(auVar90,*(undefined1 (*) [16])(local_57e0 + (long)local_54a4 * 2));
    auVar17 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_5800 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(local_57c0 + (long)local_54a4 * 2));
    auVar90 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_5800 + (long)local_54a4 * 2),
                             *(undefined1 (*) [16])(local_57c0 + (long)local_54a4 * 2));
    local_5160 = auVar89._0_8_;
    uStack_5158 = auVar89._8_8_;
    local_5180 = auVar90._0_8_;
    uStack_5178 = auVar90._8_8_;
    auVar39._16_8_ = local_5160;
    auVar39._0_16_ = auVar88;
    auVar39._24_8_ = uStack_5158;
    auVar38._16_8_ = uStack_18b0;
    auVar38._0_16_ = auVar13;
    auVar38._24_8_ = uStack_18a8;
    auVar24 = vpmaddwd_avx2(auVar39,auVar38);
    auVar37._16_8_ = local_5160;
    auVar37._0_16_ = auVar88;
    auVar37._24_8_ = uStack_5158;
    auVar36._16_8_ = uStack_18f0;
    auVar36._0_16_ = auVar14;
    auVar36._24_8_ = uStack_18e8;
    auVar25 = vpmaddwd_avx2(auVar37,auVar36);
    auVar35._16_8_ = local_5180;
    auVar35._0_16_ = auVar17;
    auVar35._24_8_ = uStack_5178;
    auVar34._16_8_ = uStack_1930;
    auVar34._0_16_ = auVar15;
    auVar34._24_8_ = uStack_1928;
    auVar26 = vpmaddwd_avx2(auVar35,auVar34);
    auVar33._16_8_ = local_5180;
    auVar33._0_16_ = auVar17;
    auVar33._24_8_ = uStack_5178;
    auVar32._16_8_ = uStack_1970;
    auVar32._0_16_ = auVar16;
    auVar32._24_8_ = uStack_1968;
    auVar27 = vpmaddwd_avx2(auVar33,auVar32);
    auVar23 = vpaddd_avx2(auVar24,auVar26);
    auVar26 = vpsubd_avx2(auVar24,auVar26);
    auVar24 = vpaddd_avx2(auVar25,auVar27);
    auVar27 = vpsubd_avx2(auVar25,auVar27);
    auVar59._16_8_ = uStack_19b0;
    auVar59._0_16_ = auVar87;
    auVar59._24_8_ = uStack_19a8;
    auVar23 = vpaddd_avx2(auVar23,auVar59);
    auVar58._16_8_ = uStack_19b0;
    auVar58._0_16_ = auVar87;
    auVar58._24_8_ = uStack_19a8;
    auVar25 = vpaddd_avx2(auVar26,auVar58);
    auVar57._16_8_ = uStack_19b0;
    auVar57._0_16_ = auVar87;
    auVar57._24_8_ = uStack_19a8;
    auVar24 = vpaddd_avx2(auVar24,auVar57);
    auVar56._16_8_ = uStack_19b0;
    auVar56._0_16_ = auVar87;
    auVar56._24_8_ = uStack_19a8;
    auVar26 = vpaddd_avx2(auVar27,auVar56);
    auVar27 = vpaddd_avx2(auVar23,auVar19);
    auVar23 = vpsubd_avx2(auVar23,auVar19);
    auVar19 = vpaddd_avx2(auVar24,auVar20);
    auVar28 = vpsubd_avx2(auVar24,auVar20);
    auVar20 = vpaddd_avx2(auVar26,auVar21);
    auVar29 = vpsubd_avx2(auVar26,auVar21);
    auVar21 = vpaddd_avx2(auVar25,auVar22);
    auVar30 = vpsubd_avx2(auVar25,auVar22);
    auVar22 = vpsrad_avx2(auVar27,ZEXT416(uVar86));
    auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar86));
    auVar24 = vpsrad_avx2(auVar19,ZEXT416(uVar86));
    auVar25 = vpsrad_avx2(auVar28,ZEXT416(uVar86));
    auVar26 = vpsrad_avx2(auVar20,ZEXT416(uVar86));
    auVar20 = vpsrad_avx2(auVar29,ZEXT416(uVar86));
    auVar27 = vpsrad_avx2(auVar21,ZEXT416(uVar86));
    auVar19 = vpsrad_avx2(auVar30,ZEXT416(uVar86));
    auVar19 = vpackssdw_avx2(auVar22,auVar19);
    auVar20 = vpackssdw_avx2(auVar24,auVar20);
    auVar21 = vpackssdw_avx2(auVar26,auVar25);
    auVar22 = vpackssdw_avx2(auVar27,auVar23);
    auVar23 = vpunpcklwd_avx2(auVar19,auVar21);
    auVar19 = vpunpckhwd_avx2(auVar19,auVar21);
    auVar21 = vpunpcklwd_avx2(auVar20,auVar22);
    auVar20 = vpunpckhwd_avx2(auVar20,auVar22);
    auVar22 = vpunpcklwd_avx2(auVar23,auVar21);
    auVar21 = vpunpckhwd_avx2(auVar23,auVar21);
    auVar23 = vpunpcklwd_avx2(auVar19,auVar20);
    auVar19 = vpunpckhwd_avx2(auVar19,auVar20);
    auVar24 = vpunpcklqdq_avx2(auVar22,auVar23);
    auVar20 = vpunpckhqdq_avx2(auVar22,auVar23);
    auVar22 = vpunpcklqdq_avx2(auVar21,auVar19);
    auVar19 = vpunpckhqdq_avx2(auVar21,auVar19);
    auVar21 = vperm2i128_avx2(auVar24,auVar20,0x20);
    auVar23 = vperm2i128_avx2(auVar24,auVar20,0x31);
    auVar25 = vperm2i128_avx2(auVar22,auVar19,0x20);
    auVar26 = vperm2i128_avx2(auVar22,auVar19,0x31);
    if (local_5794 != 0xf) {
      uVar85 = (short)(1 << (local_4f3c & 0x1f)) - 1;
      auVar89 = vpinsrw_avx(ZEXT216(uVar85),(uint)uVar85,1);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,2);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,3);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,4);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,5);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,6);
      auVar89 = vpinsrw_avx(auVar89,(uint)uVar85,7);
      auVar90 = vpinsrw_avx(ZEXT216(uVar85),(uint)uVar85,1);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,2);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,3);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,4);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,5);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,6);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,7);
      uStack_15b0 = auVar90._0_8_;
      uStack_15a8 = auVar90._8_8_;
      uVar85 = -(short)(1 << (local_4f3c & 0x1f));
      auVar90 = vpinsrw_avx(ZEXT216(uVar85),(uint)uVar85,1);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,2);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,3);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,4);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,5);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,6);
      auVar90 = vpinsrw_avx(auVar90,(uint)uVar85,7);
      auVar88 = vpinsrw_avx(ZEXT216(uVar85),(uint)uVar85,1);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,2);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,3);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,4);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,5);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,6);
      auVar88 = vpinsrw_avx(auVar88,(uint)uVar85,7);
      auVar88 = ZEXT116(0) * auVar90 + ZEXT116(1) * auVar88;
      auVar90 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar90;
      uStack_15f0 = auVar90._0_8_;
      uStack_15e8 = auVar90._8_8_;
      auVar63._16_8_ = uStack_15b0;
      auVar63._0_16_ = auVar89;
      auVar63._24_8_ = uStack_15a8;
      auVar24 = vpminsw_avx2(auVar24,auVar63);
      auVar62._16_8_ = uStack_15b0;
      auVar62._0_16_ = auVar89;
      auVar62._24_8_ = uStack_15a8;
      auVar20 = vpminsw_avx2(auVar20,auVar62);
      auVar61._16_8_ = uStack_15b0;
      auVar61._0_16_ = auVar89;
      auVar61._24_8_ = uStack_15a8;
      auVar22 = vpminsw_avx2(auVar22,auVar61);
      auVar60._16_8_ = uStack_15b0;
      auVar60._0_16_ = auVar89;
      auVar60._24_8_ = uStack_15a8;
      auVar19 = vpminsw_avx2(auVar19,auVar60);
      auVar67._16_8_ = uStack_15f0;
      auVar67._0_16_ = auVar88;
      auVar67._24_8_ = uStack_15e8;
      vpmaxsw_avx2(auVar24,auVar67);
      auVar66._16_8_ = uStack_15f0;
      auVar66._0_16_ = auVar88;
      auVar66._24_8_ = uStack_15e8;
      vpmaxsw_avx2(auVar20,auVar66);
      auVar65._16_8_ = uStack_15f0;
      auVar65._0_16_ = auVar88;
      auVar65._24_8_ = uStack_15e8;
      vpmaxsw_avx2(auVar22,auVar65);
      auVar64._16_8_ = uStack_15f0;
      auVar64._0_16_ = auVar88;
      auVar64._24_8_ = uStack_15e8;
      vpmaxsw_avx2(auVar19,auVar64);
    }
    local_53a0 = auVar21._0_8_;
    uStack_5398 = auVar21._8_8_;
    uStack_5390 = auVar21._16_8_;
    uStack_5388 = auVar21._24_8_;
    *local_4f30 = local_53a0;
    local_4f30[1] = uStack_5398;
    local_4f30[2] = uStack_5390;
    local_4f30[3] = uStack_5388;
    local_53c0 = auVar25._0_8_;
    uStack_53b8 = auVar25._8_8_;
    uStack_53b0 = auVar25._16_8_;
    uStack_53a8 = auVar25._24_8_;
    local_4f30[4] = local_53c0;
    local_4f30[5] = uStack_53b8;
    local_4f30[6] = uStack_53b0;
    local_4f30[7] = uStack_53a8;
    local_53e0 = auVar23._0_8_;
    uStack_53d8 = auVar23._8_8_;
    uStack_53d0 = auVar23._16_8_;
    uStack_53c8 = auVar23._24_8_;
    local_4f30[8] = local_53e0;
    local_4f30[9] = uStack_53d8;
    local_4f30[10] = uStack_53d0;
    local_4f30[0xb] = uStack_53c8;
    local_5400 = auVar26._0_8_;
    uStack_53f8 = auVar26._8_8_;
    uStack_53f0 = auVar26._16_8_;
    uStack_53e8 = auVar26._24_8_;
    local_4f30[0xc] = local_5400;
    local_4f30[0xd] = uStack_53f8;
    local_4f30[0xe] = uStack_53f0;
    local_4f30[0xf] = uStack_53e8;
    local_4f30 = local_4f30 + 0x10;
  }
  return;
}

Assistant:

void itrans_dct2_h8_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 8]);
    dct2_butterfly_h8_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}